

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::getNewSymbols
          (string *__return_storage_ptr__,TPTPProofPrinter *this,string *origin,Unit *u)

{
  pointer pcVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  ConstIterator symIt;
  uint local_94;
  string local_90;
  string local_70;
  string local_50;
  
  local_94 = u->_number;
  pEVar2 = ::Lib::
           DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&((this->super_ProofPrinter)._is)->_introducedSplitNames,&local_94);
  if (pEVar2 == (Entry *)0x0) {
    local_94 = u->_number;
    pEVar3 = ::Lib::
             DHMap<unsigned_int,_Lib::Stack<std::pair<Kernel::SymbolType,_unsigned_int>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&((this->super_ProofPrinter)._is)->_introducedSymbols,&local_94);
    paVar4 = &local_50.field_2;
    pcVar1 = (origin->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + origin->_M_string_length);
    symIt.super_ConstRefIterator._stack = &pEVar3->_val;
    symIt.super_ConstRefIterator._pointer = (pEVar3->_val)._cursor;
    getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
              (__return_storage_ptr__,this,&local_50,symIt);
    _Var5._M_p = local_50._M_dataplus._M_p;
  }
  else {
    paVar4 = &local_70.field_2;
    pcVar1 = (origin->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + origin->_M_string_length);
    local_94 = u->_number;
    pEVar2 = ::Lib::
             DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&((this->super_ProofPrinter)._is)->_introducedSplitNames,&local_94);
    pcVar1 = (pEVar2->_val)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (pEVar2->_val)._M_string_length);
    getNewSymbols(__return_storage_ptr__,this,&local_70,&local_90);
    _Var5._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      _Var5._M_p = local_70._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p,paVar4->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getNewSymbols(std::string origin, Unit* u) {
    ASS(hasNewSymbols(u));

    if(_is->_introducedSplitNames.find(u->number())){
      return getNewSymbols(origin,_is->_introducedSplitNames.get(u->number()));
    }

    SymbolStack& syms = _is->_introducedSymbols.get(u->number());
    return getNewSymbols(origin, SymbolStack::ConstIterator(syms));
  }